

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

int indexof(ctmbstr item,ctmbstr *list)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  
  if (list != (ctmbstr *)0x0) {
    bVar3 = *list == (ctmbstr)0x0;
    if (!bVar3) {
      iVar1 = prvTidytmbstrcasecmp(item,*list);
      uVar2 = 0;
      while (iVar1 != 0) {
        uVar2 = (ulong)((int)uVar2 + 1);
        bVar3 = list[uVar2] == (ctmbstr)0x0;
        if (bVar3) {
          return -1;
        }
        iVar1 = prvTidytmbstrcasecmp(item,list[uVar2]);
      }
      if (!bVar3) {
        return (int)uVar2;
      }
    }
  }
  return -1;
}

Assistant:

static
int indexof( ctmbstr item, ctmbstr *list )
{
    if ( list )
    {
        uint i = 0;
        while ( list[i] != NULL ) {
            if ( TY_(tmbstrcasecmp)(item, list[i]) == 0 )
                return i;
            i++;
        }
    }

    return -1;
}